

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_ShutDown(FACTAudioEngine *pEngine)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 *in_RDI;
  FAudioReallocFunc pRealloc;
  FAudioFreeFunc pFree;
  FAudioMallocFunc pMalloc;
  FAudioMutex mutex;
  uint32_t refcount;
  uint32_t i;
  int32_t *in_stack_ffffffffffffffc8;
  FAudio *in_stack_ffffffffffffffd0;
  undefined8 uVar4;
  FAudioVoice *in_stack_ffffffffffffffe0;
  undefined8 uVar5;
  uint local_c;
  
  *(undefined1 *)(in_RDI + 0x30) = 0;
  FAudio_PlatformWaitThread(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  FAudio_PlatformLockMutex((FAudioMutex)0x1102ab);
  if (*(long *)(in_RDI + 0x26) != 0) {
    FAudio_StopEngine((FAudio *)0x1102cb);
  }
  while (*(long *)(in_RDI + 0x1e) != 0) {
    FACTWaveBank_Destroy((FACTWaveBank *)pMalloc);
  }
  while (*(long *)(in_RDI + 0x1c) != 0) {
    FACTSoundBank_Destroy((FACTSoundBank *)pRealloc);
  }
  for (local_c = 0; local_c < *(ushort *)(in_RDI + 8); local_c = local_c + 1) {
    (**(code **)(in_RDI + 0x34))(*(undefined8 *)(*(long *)(in_RDI + 0xc) + (ulong)local_c * 8));
  }
  (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0xc));
  (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0x14));
  for (local_c = 0; local_c < *(ushort *)((long)in_RDI + 0x22); local_c = local_c + 1) {
    (**(code **)(in_RDI + 0x34))(*(undefined8 *)(*(long *)(in_RDI + 0xe) + (ulong)local_c * 8));
  }
  (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0xe));
  (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0x16));
  (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0x24));
  for (local_c = 0; local_c < *(ushort *)(in_RDI + 9); local_c = local_c + 1) {
    (**(code **)(in_RDI + 0x34))
              (*(undefined8 *)(*(long *)(in_RDI + 0x18) + (ulong)local_c * 0x10 + 8));
  }
  (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0x18));
  (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0x10));
  for (local_c = 0; local_c < *(ushort *)((long)in_RDI + 0x26); local_c = local_c + 1) {
    (**(code **)(in_RDI + 0x34))
              (*(undefined8 *)(*(long *)(in_RDI + 0x1a) + (ulong)local_c * 0x10 + 8));
  }
  (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0x1a));
  (**(code **)(in_RDI + 0x34))(*(undefined8 *)(in_RDI + 0x12));
  if (*(long *)(in_RDI + 0x2a) != 0) {
    FAudioVoice_DestroyVoice(in_stack_ffffffffffffffe0);
  }
  if (*(long *)(in_RDI + 0x28) != 0) {
    FAudioVoice_DestroyVoice(in_stack_ffffffffffffffe0);
  }
  if (*(long *)(in_RDI + 0x26) != 0) {
    FAudio_Release(in_stack_ffffffffffffffd0);
  }
  uVar1 = *in_RDI;
  uVar2 = *(undefined8 *)(in_RDI + 0x2e);
  uVar5 = *(undefined8 *)(in_RDI + 0x32);
  uVar3 = *(undefined8 *)(in_RDI + 0x34);
  uVar4 = *(undefined8 *)(in_RDI + 0x36);
  SDL_memset(in_RDI,0,0x110);
  *(undefined8 *)(in_RDI + 0x32) = uVar5;
  *(undefined8 *)(in_RDI + 0x34) = uVar3;
  *(undefined8 *)(in_RDI + 0x36) = uVar4;
  *in_RDI = uVar1;
  *(undefined8 *)(in_RDI + 0x2e) = uVar2;
  FAudio_PlatformUnlockMutex((FAudioMutex)0x110621);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_ShutDown(FACTAudioEngine *pEngine)
{
	uint32_t i, refcount;
	FAudioMutex mutex;
	FAudioMallocFunc pMalloc;
	FAudioFreeFunc pFree;
	FAudioReallocFunc pRealloc;

	/* Close thread, then lock ASAP */
	pEngine->initialized = 0;
	FAudio_PlatformWaitThread(pEngine->apiThread, NULL);
	FAudio_PlatformLockMutex(pEngine->apiLock);

	/* Stop the platform stream before freeing stuff! */
	if (pEngine->audio != NULL)
	{
		FAudio_StopEngine(pEngine->audio);
	}

	/* This method destroys all existing cues, sound banks, and wave banks.
	 * It blocks until all cues are destroyed.
	 */
	while (pEngine->wbList != NULL)
	{
		FACTWaveBank_Destroy((FACTWaveBank*) pEngine->wbList->entry);
	}
	while (pEngine->sbList != NULL)
	{
		FACTSoundBank_Destroy((FACTSoundBank*) pEngine->sbList->entry);
	}

	/* Category data */
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		pEngine->pFree(pEngine->categoryNames[i]);
	}
	pEngine->pFree(pEngine->categoryNames);
	pEngine->pFree(pEngine->categories);

	/* Variable data */
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		pEngine->pFree(pEngine->variableNames[i]);
	}
	pEngine->pFree(pEngine->variableNames);
	pEngine->pFree(pEngine->variables);
	pEngine->pFree(pEngine->globalVariableValues);

	/* RPC data */
	for (i = 0; i < pEngine->rpcCount; i += 1)
	{
		pEngine->pFree(pEngine->rpcs[i].points);
	}
	pEngine->pFree(pEngine->rpcs);
	pEngine->pFree(pEngine->rpcCodes);

	/* DSP data */
	for (i = 0; i < pEngine->dspPresetCount; i += 1)
	{
		pEngine->pFree(pEngine->dspPresets[i].parameters);
	}
	pEngine->pFree(pEngine->dspPresets);
	pEngine->pFree(pEngine->dspPresetCodes);

	/* Audio resources */
	if (pEngine->reverbVoice != NULL)
	{
		FAudioVoice_DestroyVoice(pEngine->reverbVoice);
	}
	if (pEngine->master != NULL)
	{
		FAudioVoice_DestroyVoice(pEngine->master);
	}
	if (pEngine->audio != NULL)
	{
		FAudio_Release(pEngine->audio);
	}

	/* Finally. */
	refcount = pEngine->refcount;
	mutex = pEngine->apiLock;
	pMalloc = pEngine->pMalloc;
	pFree = pEngine->pFree;
	pRealloc = pEngine->pRealloc;
	FAudio_zero(pEngine, sizeof(FACTAudioEngine));
	pEngine->pMalloc = pMalloc;
	pEngine->pFree = pFree;
	pEngine->pRealloc = pRealloc;
	pEngine->refcount = refcount;
	pEngine->apiLock = mutex;

	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}